

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O3

Type __thiscall wasm::TranslateToFuzzReader::getConcreteType(TranslateToFuzzReader *this)

{
  uint32_t uVar1;
  Type TVar2;
  
  if (((this->wasm->features).features & 0x200) != 0) {
    uVar1 = Random::upTo(&this->random,5);
    if (uVar1 == 0) {
      TVar2 = getTupleType(this);
      return (Type)TVar2.id;
    }
  }
  TVar2 = getSingleConcreteType(this);
  return (Type)TVar2.id;
}

Assistant:

Type TranslateToFuzzReader::getConcreteType() {
  if (wasm.features.hasMultivalue() && oneIn(5)) {
    return getTupleType();
  } else {
    return getSingleConcreteType();
  }
}